

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  CleanupNode *pCVar2;
  SerialArena *arena;
  CleanupNode *pCVar3;
  CleanupNode *pCVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uStack_30;
  LogMessageFatal aLStack_28 [16];
  
  arena = GetSerialArena(this);
  pCVar1 = (arena->cleanup_list_).next_;
  if (pCVar1 < (arena->cleanup_list_).limit_) {
    (arena->cleanup_list_).next_ = pCVar1 + 1;
    pCVar1->elem = elem;
    pCVar1->destructor = cleanup;
  }
  else {
    internal::cleanup::ChunkList::AddFallback(&arena->cleanup_list_,elem,cleanup,arena);
  }
  pCVar1 = (CleanupNode *)(arena->cleanup_list_).prefetch_ptr_;
  if ((pCVar1 != (CleanupNode *)0x0) && (pCVar1 < (CleanupNode *)(arena->cleanup_list_).head_)) {
    pcVar6 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    uStack_30 = 0x90;
    uVar5 = 0x137;
LAB_00129ea0:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
               ,uVar5,uStack_30,pcVar6);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
  }
  pCVar2 = (arena->cleanup_list_).next_;
  pCVar3 = pCVar1;
  if (((long)pCVar1 - (long)pCVar2 < 0x181) &&
     (pCVar4 = (arena->cleanup_list_).limit_, pCVar1 < pCVar4)) {
    pCVar3 = pCVar2;
    if (pCVar2 < pCVar1) {
      pCVar3 = pCVar1;
    }
    if (pCVar3 == (CleanupNode *)0x0) {
      pcVar6 = "prefetch_ptr != nullptr";
      uStack_30 = 0x17;
      uVar5 = 0x123;
      goto LAB_00129ea0;
    }
    if (pCVar3 + 0x18 < pCVar4) {
      pCVar4 = pCVar3 + 0x18;
    }
    for (; pCVar3 < pCVar4; pCVar3 = pCVar3 + 4) {
    }
  }
  (arena->cleanup_list_).prefetch_ptr_ = (char *)pCVar3;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}